

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.c
# Opt level: O2

void * mi_heap_try_new(mi_heap_t *heap,size_t size,_Bool nothrow)

{
  _Bool _Var1;
  void *pvVar2;
  
  pvVar2 = (void *)0x0;
  while( true ) {
    if (pvVar2 != (void *)0x0) {
      return pvVar2;
    }
    _Var1 = mi_try_new_handler(nothrow);
    if (!_Var1) break;
    pvVar2 = mi_heap_malloc(heap,size);
  }
  return (void *)0x0;
}

Assistant:

void* mi_heap_try_new(mi_heap_t* heap, size_t size, bool nothrow ) {
  void* p = NULL;
  while(p == NULL && mi_try_new_handler(nothrow)) {
    p = mi_heap_malloc(heap,size);
  }
  return p;
}